

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O2

vm_tadsobj_hdr *
vm_tadsobj_hdr::expand_to
          (CVmObjTads *self,vm_tadsobj_hdr *hdr,size_t new_sc_cnt,size_t new_prop_cnt)

{
  vm_prop_id_t *pvVar1;
  ushort uVar2;
  vm_tadsobj_prop *pvVar3;
  vm_tadsobj_hdr *this;
  uint uVar4;
  long lVar5;
  
  this = alloc(self,(unsigned_short)new_sc_cnt,(unsigned_short)new_prop_cnt);
  uVar4 = (uint)hdr->sc_cnt;
  if (new_sc_cnt <= hdr->sc_cnt) {
    uVar4 = (uint)new_sc_cnt;
  }
  memcpy(this->sc,hdr->sc,(ulong)(uVar4 << 4));
  this->li_obj_flags = hdr->li_obj_flags;
  this->intern_obj_flags = hdr->intern_obj_flags;
  if (hdr->sc_cnt != new_sc_cnt) {
    inval_inh_path(hdr);
  }
  this->inh_path = hdr->inh_path;
  uVar2 = hdr->prop_entry_free;
  pvVar3 = hdr->prop_entry_arr;
  for (lVar5 = 0; (ulong)uVar2 * 0x28 - lVar5 != 0; lVar5 = lVar5 + 0x28) {
    pvVar1 = (vm_prop_id_t *)((long)&pvVar3->prop + lVar5);
    alloc_prop_entry(this,*pvVar1,(vm_val_t *)(pvVar1 + 0xc),(uint)(byte)pvVar1[8]);
  }
  (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])(G_mem_X->varheap_,hdr);
  return this;
}

Assistant:

vm_tadsobj_hdr *vm_tadsobj_hdr::expand_to(VMG_ CVmObjTads *self,
                                          vm_tadsobj_hdr *hdr,
                                          size_t new_sc_cnt,
                                          size_t new_prop_cnt)
{
    vm_tadsobj_hdr *new_hdr;
    size_t i;
    vm_tadsobj_prop *entryp;

    /* allocate a new object at the expanded property table size */
    new_hdr = alloc(vmg_ self, (ushort)new_sc_cnt, (ushort)new_prop_cnt);

    /* copy the superclasses from the original object */
    memcpy(new_hdr->sc, hdr->sc,
           (hdr->sc_cnt < new_sc_cnt ? hdr->sc_cnt : new_sc_cnt)
           * sizeof(hdr->sc[0]));

    /* use the same flags from the original object */
    new_hdr->li_obj_flags = hdr->li_obj_flags;
    new_hdr->intern_obj_flags = hdr->intern_obj_flags;

    /* 
     *   if the superclass count is changing, we're obviously changing the
     *   inheritance structure, in which case the old cached inheritance path
     *   is invalid - delete it if so 
     */
    if (new_sc_cnt != hdr->sc_cnt)
        hdr->inval_inh_path();

    /* copy the old inheritance path (if we still have one) */
    new_hdr->inh_path = hdr->inh_path;

    /* 
     *   Run through all of the existing properties and duplicate them in the
     *   new object, to build the new object's hash table.  Note that the
     *   free index is inherently equivalent to the count of properties in
     *   use.  
     */
    for (i = hdr->prop_entry_free, entryp = hdr->prop_entry_arr ; i != 0 ;
         --i, ++entryp)
    {
        /* add this property to the new table */
        new_hdr->alloc_prop_entry(entryp->prop, &entryp->val, entryp->flags);
    }

    /* delete the old header */
    G_mem->get_var_heap()->free_mem(hdr);
    
    /* return the new header */
    return new_hdr;
}